

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

_Bool arena_decay_impl(tsdn_t *tsdn,arena_t *arena,arena_decay_t *decay,extents_t *extents,
                      _Bool is_background_thread,_Bool all)

{
  _Bool _Var1;
  size_t npages_decay_max;
  undefined7 in_register_00000089;
  
  if ((int)CONCAT71(in_register_00000089,all) == 0) {
    _Var1 = malloc_mutex_trylock_final(&decay->mtx);
    if (_Var1) {
      (decay->mtx).field_0.field_0.locked.repr = true;
      _Var1 = true;
    }
    else {
      mutex_owner_stats_update(tsdn,&decay->mtx);
      _Var1 = arena_maybe_decay(tsdn,arena,decay,extents,is_background_thread);
      if (_Var1) {
        extents = (extents_t *)decay->backlog[199];
      }
      (decay->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x40));
      if ((_Var1 & background_thread_enabled_state.repr) == 1 && !is_background_thread) {
        background_thread_interval_check(tsdn,arena,decay,(size_t)extents);
      }
      _Var1 = false;
    }
  }
  else {
    malloc_mutex_lock(tsdn,&decay->mtx);
    npages_decay_max = extents_npages_get(extents);
    _Var1 = false;
    arena_decay_to_limit(tsdn,arena,decay,extents,true,0,npages_decay_max,is_background_thread);
    (decay->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x40));
  }
  return _Var1;
}

Assistant:

static bool
arena_decay_impl(tsdn_t *tsdn, arena_t *arena, arena_decay_t *decay,
    extents_t *extents, bool is_background_thread, bool all) {
	if (all) {
		malloc_mutex_lock(tsdn, &decay->mtx);
		arena_decay_to_limit(tsdn, arena, decay, extents, all, 0,
		    extents_npages_get(extents), is_background_thread);
		malloc_mutex_unlock(tsdn, &decay->mtx);

		return false;
	}

	if (malloc_mutex_trylock(tsdn, &decay->mtx)) {
		/* No need to wait if another thread is in progress. */
		return true;
	}

	bool epoch_advanced = arena_maybe_decay(tsdn, arena, decay, extents,
	    is_background_thread);
	size_t npages_new;
	if (epoch_advanced) {
		/* Backlog is updated on epoch advance. */
		npages_new = decay->backlog[SMOOTHSTEP_NSTEPS-1];
	}
	malloc_mutex_unlock(tsdn, &decay->mtx);

	if (have_background_thread && background_thread_enabled() &&
	    epoch_advanced && !is_background_thread) {
		background_thread_interval_check(tsdn, arena, decay,
		    npages_new);
	}

	return false;
}